

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
CommandLineOptions::CommandLineOptions(CommandLineOptions *this,CommandLineOptions *param_1)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined3 uVar17;
  bool bVar18;
  undefined3 uVar19;
  SampleMode SVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  this->blankEOF = param_1->blankEOF;
  (this->comment)._M_dataplus._M_p = (pointer)&(this->comment).field_2;
  pcVar1 = (param_1->comment)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->comment,pcVar1,pcVar1 + (param_1->comment)._M_string_length);
  (this->delimiter)._M_dataplus._M_p = (pointer)&(this->delimiter).field_2;
  pcVar1 = (param_1->delimiter)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->delimiter,pcVar1,pcVar1 + (param_1->delimiter)._M_string_length);
  (this->fileInput)._M_dataplus._M_p = (pointer)&(this->fileInput).field_2;
  pcVar1 = (param_1->fileInput)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fileInput,pcVar1,pcVar1 + (param_1->fileInput)._M_string_length);
  (this->fileOutput)._M_dataplus._M_p = (pointer)&(this->fileOutput).field_2;
  pcVar1 = (param_1->fileOutput)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fileOutput,pcVar1,pcVar1 + (param_1->fileOutput)._M_string_length);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->filterColumns,&param_1->filterColumns);
  std::vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>::vector
            (&(this->filterRows)._stringFilters,&(param_1->filterRows)._stringFilters);
  std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
  vector(&(this->filterRows)._numericFilters,&(param_1->filterRows)._numericFilters);
  uVar21 = param_1->headerRow;
  uVar22 = param_1->numLinesToKeep;
  uVar23 = param_1->numLinesToReshape;
  uVar24 = param_1->numLinesToSkip;
  bVar18 = param_1->removeDuplicates;
  uVar19 = *(undefined3 *)&param_1->field_0xf1;
  SVar20 = (param_1->sampling).mode;
  uVar2 = *(undefined8 *)&(param_1->sampling).step;
  bVar4 = param_1->showCorrelation;
  bVar5 = param_1->showCovariance;
  bVar6 = param_1->showHistogram;
  bVar7 = param_1->showFilteredData;
  bVar8 = param_1->showLeastSquaresOffset;
  bVar9 = param_1->showLeastSquaresSlope;
  bVar10 = param_1->showStatistics;
  uVar11 = param_1->field_0x107;
  bVar12 = (param_1->statisticsOptions).doCov;
  bVar13 = (param_1->statisticsOptions).doMax;
  bVar14 = (param_1->statisticsOptions).doMean;
  bVar15 = (param_1->statisticsOptions).doMin;
  bVar16 = (param_1->statisticsOptions).doVar;
  uVar17 = *(undefined3 *)&(param_1->statisticsOptions).field_0x5;
  uVar3 = *(undefined8 *)((long)&(param_1->statisticsOptions).histogramOptions.cacheSize + 2);
  *(undefined8 *)&(this->statisticsOptions).field_0x6 =
       *(undefined8 *)&(param_1->statisticsOptions).field_0x6;
  *(undefined8 *)((long)&(this->statisticsOptions).histogramOptions.cacheSize + 2) = uVar3;
  this->showCorrelation = bVar4;
  this->showCovariance = bVar5;
  this->showHistogram = bVar6;
  this->showFilteredData = bVar7;
  this->showLeastSquaresOffset = bVar8;
  this->showLeastSquaresSlope = bVar9;
  this->showStatistics = bVar10;
  this->field_0x107 = uVar11;
  (this->statisticsOptions).doCov = bVar12;
  (this->statisticsOptions).doMax = bVar13;
  (this->statisticsOptions).doMean = bVar14;
  (this->statisticsOptions).doMin = bVar15;
  (this->statisticsOptions).doVar = bVar16;
  *(undefined3 *)&(this->statisticsOptions).field_0x5 = uVar17;
  this->removeDuplicates = bVar18;
  *(undefined3 *)&this->field_0xf1 = uVar19;
  (this->sampling).mode = SVar20;
  *(undefined8 *)&(this->sampling).step = uVar2;
  this->headerRow = uVar21;
  this->numLinesToKeep = uVar22;
  this->numLinesToReshape = uVar23;
  this->numLinesToSkip = uVar24;
  return;
}

Assistant:

CommandLineOptions()
    {
        this->blankEOF = false;
        this->comment = "";
        this->delimiter = "";
        this->fileInput = "";
        this->fileOutput = "";
        this->filterColumns = std::vector<bool>();
        this->headerRow = 0;
        this->numLinesToKeep = std::numeric_limits<int>::max();
        this->numLinesToReshape = 1;
        this->numLinesToSkip = 0;
        this->removeDuplicates = false;
        this->seed = 1;
        this->showCorrelation = false;
        this->showCovariance = false;
        this->showFilteredData = false;
        this->showHistogram = false;
        this->showLeastSquaresOffset = false;
        this->showLeastSquaresSlope = false;
        this->showStatistics = false;
        this->strictParsing = false;
        this->verboseLevel = 0;
    }